

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O1

USTATUS LzmaGetInfo(void *Source,UINT32 SourceSize,UINT32 *DestinationSize)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0xc < SourceSize) {
    uVar2 = 0xd;
    uVar3 = 0;
    do {
      uVar4 = uVar3 << 8;
      uVar3 = *(byte *)((long)Source + (uVar2 - 1)) | uVar4;
      uVar2 = uVar2 - 1;
    } while (5 < uVar2);
    bVar1 = uVar4 >> 0x20 != 0;
    if (!bVar1) {
      *DestinationSize = (UINT32)uVar3;
    }
    return (ulong)bVar1;
  }
  __assert_fail("SourceSize >= (5 + 8)",
                "/workspace/llm4binary/github/license_c_cmakelists/LongSoft[P]UEFITool/common/LZMA/LzmaDecompress.c"
                ,0x61,"USTATUS LzmaGetInfo(const void *, UINT32, UINT32 *)");
}

Assistant:

USTATUS
EFIAPI
LzmaGetInfo (
    CONST VOID  *Source,
    UINT32       SourceSize,
    UINT32       *DestinationSize
    )
{
    UINT64 DecodedSize;
    ASSERT(SourceSize >= LZMA_HEADER_SIZE);
    (void)SourceSize;

    DecodedSize = GetDecodedSizeOfBuf((UINT8*)Source);

    if (DecodedSize <= UINT32_MAX) {
        *DestinationSize = (UINT32)DecodedSize;
        return U_SUCCESS;
    }
    else {
        return U_INVALID_PARAMETER;
    }
}